

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

void deqp::gles31::Functional::checkProgramResourceUsage
               (Program *program,Functions *gl,TestLog *log)

{
  ostringstream *poVar1;
  Shader *shader;
  bool bVar2;
  deUint32 dVar3;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar4;
  NotSupportedError *this;
  byte bVar5;
  long lVar6;
  byte bVar7;
  int ndx;
  long lVar8;
  anon_struct_8_2_e2d7eaeb restrictions [11];
  ShaderResourceUsage usage;
  GLenum local_2e8;
  deUint32 local_2e4 [49];
  Program *local_220;
  ProgramResourceUsage local_214;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pvVar4 = ProgramInterfaceDefinition::Program::getShaders(program);
  if ((int)((ulong)((long)(pvVar4->
                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar4->
                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
    bVar7 = 0;
  }
  else {
    lVar6 = 0;
    bVar7 = 0;
    local_220 = program;
    do {
      pvVar4 = ProgramInterfaceDefinition::Program::getShaders(program);
      shader = (pvVar4->
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar6];
      getShaderResourceUsage((ShaderResourceUsage *)&local_214,program,shader);
      switch(shader->m_shaderType) {
      case SHADERTYPE_VERTEX:
        local_2e4[0] = local_214.uniformBufferMaxSize;
        local_2e4[1] = 0x8b4a;
        local_2e4[2] = local_214.shaderStorageBufferMaxBinding;
        local_2e4[3] = 0x8dfb;
        local_2e4[4] = local_214.numShaderStorageBlocks;
        local_2e4[5] = 0x8a2b;
        local_2e4[6] = local_214.atomicCounterBufferMaxSize;
        local_2e4[7] = 0x9122;
        local_2e4[8] = local_214.numCombinedGeometryUniformComponents;
        local_2e4[9] = 0x8b4c;
        local_2e4[10] = local_214.numVaryingComponents;
        local_2e4[0xb] = 0x92cc;
        local_2e4[0xc] = local_214.numCombinedSamplers;
        local_2e4[0xd] = 0x92d2;
        local_2e4[0xe] = local_214.atomicCounterBufferMaxBinding;
        local_2e4[0xf] = 0x90ca;
        local_2e4[0x10] = local_214.numVaryingVectors;
        local_2e4[0x11] = 0x8a31;
        local_2e4[0x12] = local_214.shaderStorageBufferMaxSize;
        local_2e4[0x13] = 0x90d6;
        local_2e4[0x14] = local_214.numAtomicCounterBuffers;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Vertex shader:",0xe);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = 1;
        lVar8 = 0;
        do {
          bVar2 = checkLimit(local_2e4[lVar8 * 2 + -1],local_2e4[lVar8 * 2],gl,log);
          bVar5 = bVar5 & bVar2;
          lVar8 = lVar8 + 1;
          program = local_220;
        } while (lVar8 != 0xb);
        break;
      case SHADERTYPE_FRAGMENT:
        local_2e4[0] = local_214.shaderStorageBufferMaxBinding;
        local_2e4[1] = 0x8dfd;
        local_2e4[2] = local_214.numShaderStorageBlocks;
        local_2e4[3] = 0x8a2d;
        local_2e4[4] = local_214.atomicCounterBufferMaxSize;
        local_2e4[5] = 0x9125;
        local_2e4[6] = local_214.numUniformBlocks;
        local_2e4[7] = 0x8872;
        local_2e4[8] = local_214.numVaryingComponents;
        local_2e4[9] = 0x92d0;
        local_2e4[10] = local_214.numCombinedSamplers;
        local_2e4[0xb] = 0x92d6;
        local_2e4[0xc] = local_214.atomicCounterBufferMaxBinding;
        local_2e4[0xd] = 0x90ce;
        local_2e4[0xe] = local_214.numVaryingVectors;
        local_2e4[0xf] = 0x8a33;
        local_2e4[0x10] = local_214.shaderStorageBufferMaxSize;
        local_2e4[0x11] = 0x90da;
        local_2e4[0x12] = local_214.numAtomicCounterBuffers;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Fragment shader:",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = 1;
        lVar8 = 0;
        do {
          bVar2 = checkLimit(local_2e4[lVar8 * 2 + -1],local_2e4[lVar8 * 2],gl,log);
          bVar5 = bVar5 & bVar2;
          lVar8 = lVar8 + 1;
          program = local_220;
        } while (lVar8 != 10);
        break;
      case SHADERTYPE_GEOMETRY:
        dVar3 = ProgramInterfaceDefinition::Program::getGeometryNumOutputVertices(program);
        dVar3 = dVar3 * local_214.numCombinedGeometryUniformComponents;
        local_2e4[0] = local_214.shaderStorageBufferMaxBinding;
        local_2e4[1] = 0x8a2c;
        local_2e4[2] = local_214.atomicCounterBufferMaxSize;
        local_2e4[3] = 0x9123;
        local_2e4[4] = local_214.numUniformBlocks;
        local_2e4[5] = 0x9124;
        local_2e4[6] = local_214.numCombinedGeometryUniformComponents;
        local_2e4[7] = 0x8de0;
        local_2e4[8] = ProgramInterfaceDefinition::Program::getGeometryNumOutputVertices(program);
        local_2e4[9] = 0x8de1;
        local_2e4[0xb] = 0x8c29;
        local_2e4[0xc] = local_214.numVaryingComponents;
        local_2e4[0xd] = 0x92cf;
        local_2e4[0xe] = local_214.numCombinedSamplers;
        local_2e4[0xf] = 0x92d5;
        local_2e4[0x10] = local_214.atomicCounterBufferMaxBinding;
        local_2e4[0x11] = 0x90cd;
        local_2e4[0x12] = local_214.numVaryingVectors;
        local_2e4[0x13] = 0x90d7;
        local_2e4[0x14] = local_214.numAtomicCounterBuffers;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_2e4[10] = dVar3;
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Geometry shader:",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = 1;
        lVar8 = 0;
        do {
          bVar2 = checkLimit(local_2e4[lVar8 * 2 + -1],local_2e4[lVar8 * 2],gl,log);
          bVar5 = bVar5 & bVar2;
          lVar8 = lVar8 + 1;
          program = local_220;
        } while (lVar8 != 0xb);
        break;
      case SHADERTYPE_TESSELLATION_CONTROL:
        dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
        dVar3 = dVar3 * local_214.numCombinedGeometryUniformComponents +
                local_214.numCombinedTessEvalUniformComponents;
        local_2e4[0] = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices
                                 (program);
        local_2e4[1] = 0x8e84;
        local_2e4[2] = local_214.numCombinedTessEvalUniformComponents;
        local_2e4[3] = 0x8e7f;
        local_2e4[4] = local_214.shaderStorageBufferMaxBinding;
        local_2e4[5] = 0x8e89;
        local_2e4[6] = local_214.atomicCounterBufferMaxSize;
        local_2e4[7] = 0x886c;
        local_2e4[8] = local_214.numUniformBlocks;
        local_2e4[9] = 0x8e83;
        local_2e4[10] = local_214.numCombinedGeometryUniformComponents;
        local_2e4[0xb] = 0x8e85;
        local_2e4[0xd] = 0x8e81;
        local_2e4[0xe] = local_214.numVaryingComponents;
        local_2e4[0xf] = 0x92cd;
        local_2e4[0x10] = local_214.numCombinedSamplers;
        local_2e4[0x11] = 0x92d3;
        local_2e4[0x12] = local_214.atomicCounterBufferMaxBinding;
        local_2e4[0x13] = 0x90cb;
        local_2e4[0x14] = local_214.numVaryingVectors;
        local_2e4[0x15] = 0x90d8;
        local_2e4[0x16] = local_214.numAtomicCounterBuffers;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_2e4[0xc] = dVar3;
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Tessellation control shader:",0x1c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = 1;
        lVar8 = 0;
        do {
          bVar2 = checkLimit(local_2e4[lVar8 * 2 + -1],local_2e4[lVar8 * 2],gl,log);
          bVar5 = bVar5 & bVar2;
          lVar8 = lVar8 + 1;
          program = local_220;
        } while (lVar8 != 0xc);
        break;
      case SHADERTYPE_TESSELLATION_EVALUATION:
        local_2e4[0] = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices
                                 (program);
        local_2e4[1] = 0x8e84;
        local_2e4[2] = local_214.numCombinedTessControlUniformComponents;
        local_2e4[3] = 0x8e80;
        local_2e4[4] = local_214.shaderStorageBufferMaxBinding;
        local_2e4[5] = 0x8e8a;
        local_2e4[6] = local_214.atomicCounterBufferMaxSize;
        local_2e4[7] = 0x886d;
        local_2e4[8] = local_214.numUniformBlocks;
        local_2e4[9] = 0x8e86;
        local_2e4[10] = local_214.numCombinedGeometryUniformComponents;
        local_2e4[0xb] = 0x8e82;
        local_2e4[0xc] = local_214.numVaryingComponents;
        local_2e4[0xd] = 0x92ce;
        local_2e4[0xe] = local_214.numCombinedSamplers;
        local_2e4[0xf] = 0x92d4;
        local_2e4[0x10] = local_214.atomicCounterBufferMaxBinding;
        local_2e4[0x11] = 0x90cc;
        local_2e4[0x12] = local_214.numVaryingVectors;
        local_2e4[0x13] = 0x90d9;
        local_2e4[0x14] = local_214.numAtomicCounterBuffers;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Tessellation evaluation shader:",0x1f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = 1;
        lVar8 = 0;
        do {
          bVar2 = checkLimit(local_2e4[lVar8 * 2 + -1],local_2e4[lVar8 * 2],gl,log);
          bVar5 = bVar5 & bVar2;
          lVar8 = lVar8 + 1;
          program = local_220;
        } while (lVar8 != 0xb);
        break;
      case SHADERTYPE_COMPUTE:
        local_2e4[0] = local_214.atomicCounterBufferMaxSize;
        local_2e4[1] = 0x91bc;
        local_2e4[2] = local_214.numVaryingComponents;
        local_2e4[3] = 0x8263;
        local_2e4[4] = local_214.shaderStorageBufferMaxBinding;
        local_2e4[5] = 0x8264;
        local_2e4[6] = local_214.numCombinedSamplers;
        local_2e4[7] = 0x8265;
        local_2e4[8] = local_214.atomicCounterBufferMaxBinding;
        local_2e4[9] = 0x91bd;
        local_2e4[10] = local_214.numVaryingVectors;
        local_2e4[0xb] = 0x8266;
        local_2e4[0xc] = local_214.shaderStorageBufferMaxSize;
        local_2e4[0xd] = 0x90db;
        local_2e4[0xe] = local_214.numAtomicCounterBuffers;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Compute shader:",0xf);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = 1;
        lVar8 = 0;
        do {
          bVar2 = checkLimit(local_2e4[lVar8 * 2 + -1],local_2e4[lVar8 * 2],gl,log);
          bVar5 = bVar5 & bVar2;
          lVar8 = lVar8 + 1;
          program = local_220;
        } while (lVar8 != 8);
        break;
      default:
        bVar5 = 0;
      }
      bVar7 = bVar7 | bVar5 ^ 1;
      lVar6 = lVar6 + 1;
      pvVar4 = ProgramInterfaceDefinition::Program::getShaders(program);
    } while (lVar6 < (int)((ulong)((long)(pvVar4->
                                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar4->
                                        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  getCombinedProgramResourceUsage(&local_214,program);
  local_2e4[0] = local_214.uniformBufferMaxBinding + 1;
  local_2e4[1] = 0x8a30;
  local_2e4[2] = local_214.uniformBufferMaxSize;
  local_2e4[3] = 0x8a2e;
  local_2e4[4] = local_214.numUniformBlocks;
  local_2e4[5] = 0x8a31;
  local_2e4[6] = local_214.numCombinedVertexUniformComponents;
  local_2e4[7] = 0x8a33;
  local_2e4[8] = local_214.numCombinedFragmentUniformComponents;
  local_2e4[9] = 0x8a32;
  local_2e4[10] = local_214.numCombinedGeometryUniformComponents;
  local_2e4[0xb] = 0x8e1e;
  local_2e4[0xc] = local_214.numCombinedTessControlUniformComponents;
  local_2e4[0xd] = 0x8e1f;
  local_2e4[0xe] = local_214.numCombinedTessEvalUniformComponents;
  local_2e4[0xf] = 0x8b4b;
  local_2e4[0x10] = local_214.numVaryingComponents;
  local_2e4[0x11] = 0x8dfc;
  local_2e4[0x12] = local_214.numVaryingVectors;
  local_2e4[0x13] = 0x8b4d;
  local_2e4[0x14] = local_214.numCombinedSamplers;
  local_2e4[0x15] = 0x8f39;
  local_2e4[0x16] = local_214.numCombinedOutputResources;
  local_2e4[0x17] = 0x92dc;
  local_2e4[0x18] = local_214.atomicCounterBufferMaxBinding + 1;
  local_2e4[0x19] = 0x92d8;
  local_2e4[0x1a] = local_214.atomicCounterBufferMaxSize;
  local_2e4[0x1b] = 0x92d1;
  local_2e4[0x1c] = local_214.numAtomicCounterBuffers;
  local_2e4[0x1d] = 0x92d7;
  local_2e4[0x1e] = local_214.numAtomicCounters;
  local_2e4[0x1f] = 0x8f38;
  local_2e4[0x20] = local_214.maxImageBinding + 1;
  local_2e4[0x21] = 0x90cf;
  local_2e4[0x22] = local_214.numCombinedImages;
  local_2e4[0x23] = 0x90dd;
  local_2e4[0x24] = local_214.shaderStorageBufferMaxBinding + 1;
  local_2e4[0x25] = 0x90de;
  local_2e4[0x26] = local_214.shaderStorageBufferMaxSize;
  local_2e4[0x27] = 0x90dc;
  local_2e4[0x28] = local_214.numShaderStorageBlocks;
  local_2e4[0x29] = 0x8c8a;
  local_2e4[0x2a] = local_214.numXFBInterleavedComponents;
  local_2e4[0x2b] = 0x8c8b;
  local_2e4[0x2c] = local_214.numXFBSeparateAttribs;
  local_2e4[0x2d] = 0x8c80;
  local_2e4[0x2e] = local_214.numXFBSeparateComponents;
  local_2e4[0x2f] = 0x8824;
  local_2e4[0x30] = local_214.fragmentOutputMaxBinding + 1;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Program combined:",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  bVar5 = 1;
  lVar6 = 0;
  do {
    bVar2 = checkLimit(local_2e4[lVar6 * 2 + -1],local_2e4[lVar6 * 2],gl,log);
    bVar5 = bVar5 & bVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x19);
  if (bVar7 != 0 || (~bVar5 & 1) != 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One or more resource limits exceeded",0x24);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"one or more resource limits exceeded","");
    tcu::NotSupportedError::NotSupportedError(this,(string *)local_1b0);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void checkProgramResourceUsage (const ProgramInterfaceDefinition::Program* program, const glw::Functions& gl, tcu::TestLog& log)
{
	bool limitExceeded = false;

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
		limitExceeded |= !checkShaderResourceUsage(program, program->getShaders()[shaderNdx], gl, log);

	limitExceeded |= !checkProgramCombinedResourceUsage(program, gl, log);

	if (limitExceeded)
	{
		log << tcu::TestLog::Message << "One or more resource limits exceeded" << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("one or more resource limits exceeded");
	}
}